

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_p_race(void)

{
  player_race *ppVar1;
  player_race *p;
  
  p = races;
  if (races != (player_race *)0x0) {
    do {
      ppVar1 = p->next;
      string_free(p->name);
      mem_free(p);
      p = ppVar1;
    } while (ppVar1 != (player_race *)0x0);
  }
  return;
}

Assistant:

static void cleanup_p_race(void)
{
	struct player_race *p = races;
	struct player_race *next;

	while (p) {
		next = p->next;
		string_free((char *)p->name);
		mem_free(p);
		p = next;
	}
}